

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_cost.h
# Opt level: O0

double brotli::PopulationCost<704>(Histogram<704> *histogram)

{
  long lVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Histogram<704> *local_380;
  double local_378;
  size_t k;
  ulong uStack_368;
  uint32_t reps;
  size_t depth;
  double log2p;
  size_t i_2;
  double log2total;
  uint32_t depth_histo [18];
  ulong local_2f8;
  size_t max_depth;
  byte local_2e8 [4];
  int i_1;
  uint8_t depth_array [704];
  double bits;
  int i;
  int count;
  Histogram<704> *histogram_local;
  
  if (histogram->total_count_ == 0) {
    histogram_local = (Histogram<704> *)0x4028000000000000;
  }
  else {
    bits._4_4_ = 0;
    for (bits._0_4_ = 0; bits._0_4_ < 0x2c0; bits._0_4_ = bits._0_4_ + 1) {
      if (histogram->data_[bits._0_4_] != 0) {
        bits._4_4_ = bits._4_4_ + 1;
      }
    }
    if (bits._4_4_ == 1) {
      histogram_local = (Histogram<704> *)0x4028000000000000;
    }
    else if (bits._4_4_ == 2) {
      lVar1 = histogram->total_count_ + 0x14;
      auVar6._8_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar6._0_8_ = lVar1;
      auVar6._12_4_ = 0x45300000;
      histogram_local =
           (Histogram<704> *)
           ((auVar6._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0));
    }
    else {
      depth_array[0x2b8] = '\0';
      depth_array[0x2b9] = '\0';
      depth_array[0x2ba] = '\0';
      depth_array[699] = '\0';
      depth_array[700] = '\0';
      depth_array[0x2bd] = '\0';
      depth_array[0x2be] = '\0';
      depth_array[0x2bf] = '\0';
      memset(local_2e8,0,0x2c0);
      if (bits._4_4_ < 5) {
        CreateHuffmanTree(histogram->data_,0x2c0,0xf,local_2e8);
        for (max_depth._4_4_ = 0; max_depth._4_4_ < 0x2c0; max_depth._4_4_ = max_depth._4_4_ + 1) {
          depth_array._696_8_ =
               (double)(histogram->data_[max_depth._4_4_] * (uint)local_2e8[max_depth._4_4_]) +
               (double)depth_array._696_8_;
        }
        if (bits._4_4_ == 3) {
          local_380 = (Histogram<704> *)((double)depth_array._696_8_ + 28.0);
        }
        else {
          local_380 = (Histogram<704> *)((double)depth_array._696_8_ + 37.0);
        }
        histogram_local = local_380;
      }
      else {
        local_2f8 = 1;
        memset(&log2total,0,0x48);
        dVar3 = FastLog2(histogram->total_count_);
        log2p = 0.0;
        while ((ulong)log2p < 0x2c0) {
          if (histogram->data_[(long)log2p] == 0) {
            k._4_4_ = 1;
            dVar4 = log2p;
            while( true ) {
              local_378 = (double)((long)dVar4 + 1);
              bVar2 = false;
              if ((ulong)local_378 < 0x2c0) {
                bVar2 = histogram->data_[(long)dVar4 + 1] == 0;
              }
              if (!bVar2) break;
              k._4_4_ = k._4_4_ + 1;
              dVar4 = local_378;
            }
            log2p = (double)((ulong)k._4_4_ + (long)log2p);
            if (log2p == 3.47822214672238e-321) break;
            if (k._4_4_ < 3) {
              log2total._0_4_ = k._4_4_ + log2total._0_4_;
            }
            else {
              for (k._4_4_ = k._4_4_ - 2; k._4_4_ != 0; k._4_4_ = k._4_4_ >> 3) {
                depth_histo[0xf] = depth_histo[0xf] + 1;
                depth_array._696_8_ = (double)depth_array._696_8_ + 3.0;
              }
            }
          }
          else {
            dVar4 = FastLog2((ulong)histogram->data_[(long)log2p]);
            dVar5 = (dVar3 - dVar4) + 0.5;
            uStack_368 = (ulong)dVar5;
            uStack_368 = uStack_368 |
                         (long)(dVar5 - 9.223372036854776e+18) & (long)uStack_368 >> 0x3f;
            depth_array._696_8_ =
                 (double)histogram->data_[(long)log2p] * (dVar3 - dVar4) +
                 (double)depth_array._696_8_;
            if (0xf < uStack_368) {
              uStack_368 = 0xf;
            }
            if (local_2f8 < uStack_368) {
              local_2f8 = uStack_368;
            }
            depth_histo[uStack_368 - 2] = depth_histo[uStack_368 - 2] + 1;
            log2p = (double)((long)log2p + 1);
          }
        }
        lVar1 = local_2f8 * 2 + 0x12;
        auVar7._8_4_ = (int)((ulong)lVar1 >> 0x20);
        auVar7._0_8_ = lVar1;
        auVar7._12_4_ = 0x45300000;
        depth_array._696_8_ =
             (auVar7._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0) +
             (double)depth_array._696_8_;
        dVar3 = BitsEntropy((uint32_t *)&log2total,0x12);
        histogram_local = (Histogram<704> *)(dVar3 + (double)depth_array._696_8_);
      }
    }
  }
  return (double)histogram_local;
}

Assistant:

double PopulationCost(const Histogram<kSize>& histogram) {
  if (histogram.total_count_ == 0) {
    return 12;
  }
  int count = 0;
  for (int i = 0; i < kSize; ++i) {
    if (histogram.data_[i] > 0) {
      ++count;
    }
  }
  if (count == 1) {
    return 12;
  }
  if (count == 2) {
    return static_cast<double>(20 + histogram.total_count_);
  }
  double bits = 0;
  uint8_t depth_array[kSize] = { 0 };
  if (count <= 4) {
    // For very low symbol count we build the Huffman tree.
    CreateHuffmanTree(&histogram.data_[0], kSize, 15, depth_array);
    for (int i = 0; i < kSize; ++i) {
      bits += histogram.data_[i] * depth_array[i];
    }
    return count == 3 ? bits + 28 : bits + 37;
  }

  // In this loop we compute the entropy of the histogram and simultaneously
  // build a simplified histogram of the code length codes where we use the
  // zero repeat code 17, but we don't use the non-zero repeat code 16.
  size_t max_depth = 1;
  uint32_t depth_histo[kCodeLengthCodes] = { 0 };
  const double log2total = FastLog2(histogram.total_count_);
  for (size_t i = 0; i < kSize;) {
    if (histogram.data_[i] > 0) {
      // Compute -log2(P(symbol)) = -log2(count(symbol)/total_count) =
      //                          =  log2(total_count) - log2(count(symbol))
      double log2p = log2total - FastLog2(histogram.data_[i]);
      // Approximate the bit depth by round(-log2(P(symbol)))
      size_t depth = static_cast<size_t>(log2p + 0.5);
      bits += histogram.data_[i] * log2p;
      if (depth > 15) {
        depth = 15;
      }
      if (depth > max_depth) {
        max_depth = depth;
      }
      ++depth_histo[depth];
      ++i;
    } else {
      // Compute the run length of zeros and add the appropriate number of 0 and
      // 17 code length codes to the code length code histogram.
      uint32_t reps = 1;
      for (size_t k = i + 1; k < kSize && histogram.data_[k] == 0; ++k) {
        ++reps;
      }
      i += reps;
      if (i == kSize) {
        // Don't add any cost for the last zero run, since these are encoded
        // only implicitly.
        break;
      }
      if (reps < 3) {
        depth_histo[0] += reps;
      } else {
        reps -= 2;
        while (reps > 0) {
          ++depth_histo[17];
          // Add the 3 extra bits for the 17 code length code.
          bits += 3;
          reps >>= 3;
        }
      }
    }
  }
  // Add the estimated encoding cost of the code length code histogram.
  bits += static_cast<double>(18 + 2 * max_depth);
  // Add the entropy of the code length code histogram.
  bits += BitsEntropy(depth_histo, kCodeLengthCodes);
  return bits;
}